

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereOrInsert(WhereOrSet *pSet,Bitmask prereq,LogEst rRun,LogEst nOut)

{
  ushort uVar1;
  WhereOrCost *pWVar2;
  ulong uVar3;
  long lVar4;
  WhereOrCost *pWVar5;
  WhereOrCost *pWVar6;
  ushort uVar7;
  ulong uVar8;
  
  uVar1 = pSet->n;
  uVar3 = (ulong)uVar1;
  pWVar5 = pSet->a;
  if (uVar3 == 0) {
LAB_0016e3b3:
    pSet->n = uVar1 + 1;
    uVar8 = (ulong)uVar1;
    uVar3 = uVar8 * 0x10;
    pSet->a[uVar8].nOut = nOut;
    pWVar6 = pWVar5 + uVar8;
  }
  else {
    pWVar6 = pWVar5;
    uVar8 = uVar3;
    do {
      if ((rRun <= pWVar6->rRun) && ((prereq & ~pWVar6->prereq) == 0)) goto LAB_0016e3c8;
      if ((pWVar6->rRun <= rRun) && ((pWVar6->prereq & ~prereq) == 0)) goto LAB_0016e3dc;
      pWVar6 = pWVar6 + 1;
      uVar7 = (short)uVar8 - 1;
      uVar8 = (ulong)uVar7;
    } while (uVar7 != 0);
    if (uVar1 < 3) goto LAB_0016e3b3;
    pWVar6 = pSet->a;
    lVar4 = uVar3 - 1;
    do {
      pWVar6 = pWVar6 + 1;
      pWVar2 = pWVar6;
      if (pWVar5->rRun <= pWVar6->rRun) {
        pWVar2 = pWVar5;
      }
      pWVar5 = pWVar2;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    uVar3 = 0;
    pWVar6 = pWVar5;
    if (pWVar5->rRun <= rRun) goto LAB_0016e3dc;
  }
LAB_0016e3c8:
  pWVar6->prereq = prereq;
  pWVar6->rRun = rRun;
  if (nOut < pWVar6->nOut) {
    pWVar6->nOut = nOut;
  }
LAB_0016e3dc:
  return (int)uVar3;
}

Assistant:

static int whereOrInsert(
  WhereOrSet *pSet,      /* The WhereOrSet to be updated */
  Bitmask prereq,        /* Prerequisites of the new entry */
  LogEst rRun,           /* Run-cost of the new entry */
  LogEst nOut            /* Number of outputs for the new entry */
){
  u16 i;
  WhereOrCost *p;
  for(i=pSet->n, p=pSet->a; i>0; i--, p++){
    if( rRun<=p->rRun && (prereq & p->prereq)==prereq ){
      goto whereOrInsert_done;
    }
    if( p->rRun<=rRun && (p->prereq & prereq)==p->prereq ){
      return 0;
    }
  }
  if( pSet->n<N_OR_COST ){
    p = &pSet->a[pSet->n++];
    p->nOut = nOut;
  }else{
    p = pSet->a;
    for(i=1; i<pSet->n; i++){
      if( p->rRun>pSet->a[i].rRun ) p = pSet->a + i;
    }
    if( p->rRun<=rRun ) return 0;
  }
whereOrInsert_done:
  p->prereq = prereq;
  p->rRun = rRun;
  if( p->nOut>nOut ) p->nOut = nOut;
  return 1;
}